

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_515e1e::SetPermissions
               (string *filename,mode_t *perms,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Status local_30;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  mode_t *perms_local;
  string *filename_local;
  
  local_28 = status;
  status_local = (cmExecutionStatus *)perms;
  perms_local = (mode_t *)filename;
  local_30 = cmsys::SystemTools::SetPermissions(filename,*perms,false);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_30);
  this = local_28;
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    std::operator+(&local_50,"Failed to set permissions for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)perms_local)
    ;
    cmExecutionStatus::SetError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmSystemTools::SetFatalErrorOccurred();
  }
  filename_local._7_1_ = !bVar1;
  return filename_local._7_1_;
}

Assistant:

bool SetPermissions(const std::string& filename, const mode_t& perms,
                    cmExecutionStatus& status)
{
  if (!cmSystemTools::SetPermissions(filename, perms)) {
    status.SetError("Failed to set permissions for " + filename);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  return true;
}